

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::AllOfMatcherImpl<const_char_&>::DescribeTo
          (AllOfMatcherImpl<const_char_&> *this,ostream *os)

{
  size_t i;
  ulong uVar1;
  pointer pMVar2;
  long lVar3;
  
  std::operator<<(os,"(");
  lVar3 = 0;
  for (uVar1 = 0;
      pMVar2 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar1 < (ulong)(((long)(this->matchers_).
                             super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x18);
      uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::operator<<(os,") and (");
      pMVar2 = (this->matchers_).
               super__Vector_base<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    MatcherBase<const_char_&>::DescribeTo
              ((MatcherBase<const_char_&> *)
               ((long)&(pMVar2->super_MatcherBase<const_char_&>).super_MatcherDescriberInterface.
                       _vptr_MatcherDescriberInterface + lVar3),os);
    lVar3 = lVar3 + 0x18;
  }
  std::operator<<(os,")");
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const override {
    *os << "(";
    for (size_t i = 0; i < matchers_.size(); ++i) {
      if (i != 0) *os << ") and (";
      matchers_[i].DescribeTo(os);
    }
    *os << ")";
  }